

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void lj_dispatch_init_hotcount(global_State *g)

{
  int iVar1;
  uint local_24;
  uint32_t i;
  HotCount *hotcount;
  HotCount start;
  int32_t hotloop;
  global_State *g_local;
  
  iVar1 = g[3].vmstate;
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    *(short *)((long)&g[5].tmpbuf.w + (ulong)local_24 * 2) = (short)(iVar1 << 1) + -1;
  }
  return;
}

Assistant:

void lj_dispatch_init_hotcount(global_State *g)
{
  int32_t hotloop = G2J(g)->param[JIT_P_hotloop];
  HotCount start = (HotCount)(hotloop*HOTCOUNT_LOOP - 1);
  HotCount *hotcount = G2GG(g)->hotcount;
  uint32_t i;
  for (i = 0; i < HOTCOUNT_SIZE; i++)
    hotcount[i] = start;
}